

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O1

MPP_RET vp8d_parser_deinit(void *ctx)

{
  VP8DParserContext_t *p;
  
  p = *ctx;
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x13e,
               "vp8d_parser_deinit");
  }
  if (p->bitstream_sw_buf != (RK_U8 *)0x0) {
    mpp_osal_free("vp8d_parser_deinit",p->bitstream_sw_buf);
    p->bitstream_sw_buf = (RK_U8 *)0x0;
  }
  if (p->dxva_ctx != (DXVA_PicParams_VP8 *)0x0) {
    mpp_osal_free("vp8d_parser_deinit",p->dxva_ctx);
    p->dxva_ctx = (DXVA_PicParams_VP8 *)0x0;
  }
  vp8d_unref_allframe(p);
  if (p->input_packet != (MppPacket)0x0) {
    mpp_packet_deinit(&p->input_packet);
    p->input_packet = (MppPacket)0x0;
  }
  if ((FILE *)p->stream_fp != (FILE *)0x0) {
    fclose((FILE *)p->stream_fp);
  }
  mpp_osal_free("vp8d_parser_deinit",p);
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x157,
               "vp8d_parser_deinit");
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp8d_parser_deinit(void *ctx)
{
    MPP_RET ret = MPP_OK;
    VP8DContext *c = (VP8DContext *)ctx;
    VP8DParserContext_t *p = (VP8DParserContext_t *)c->parse_ctx;

    FUN_T("FUN_IN");

    if (NULL != p->bitstream_sw_buf) {
        mpp_free(p->bitstream_sw_buf);
        p->bitstream_sw_buf = NULL;
    }

    if (NULL != p->dxva_ctx) {
        mpp_free(p->dxva_ctx);
        p->dxva_ctx = NULL;
    }

    vp8d_unref_allframe(p);

    if (p->input_packet) {
        mpp_packet_deinit(&p->input_packet);
        p->input_packet = NULL;
    }

    if (p->stream_fp)
        fclose(p->stream_fp);

    if ( NULL != p) {
        mpp_free(p);
    }
    FUN_T("FUN_OUT");
    return ret;
}